

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_default_catalog.cpp
# Opt level: O2

void ConcurrentDefaultCatalog::ScanDefaultCatalog(DuckDB *db,bool *read_correct)

{
  char cVar1;
  long lVar2;
  bool bVar3;
  allocator local_79;
  long *local_78;
  Connection con;
  string local_50 [32];
  
  duckdb::Connection::Connection(&con,db);
  *read_correct = true;
  lVar2 = 10;
  while (bVar3 = lVar2 != 0, lVar2 = lVar2 + -1, bVar3) {
    std::__cxx11::string::string(local_50,"SELECT * FROM pg_class",&local_79);
    duckdb::Connection::Query((string *)&local_78);
    std::__cxx11::string::~string(local_50);
    duckdb::
    unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
    ::operator->((unique_ptr<duckdb::MaterializedQueryResult,_std::default_delete<duckdb::MaterializedQueryResult>,_true>
                  *)&local_78);
    cVar1 = duckdb::BaseQueryResult::HasError();
    if (cVar1 != '\0') {
      *read_correct = false;
    }
    if (local_78 != (long *)0x0) {
      (**(code **)(*local_78 + 8))();
    }
  }
  duckdb::Connection::~Connection(&con);
  return;
}

Assistant:

static void ScanDefaultCatalog(DuckDB *db, bool *read_correct) {
		Connection con(*db);
		*read_correct = true;
		for (idx_t i = 0; i < CONCURRENT_DEFAULT_ITERATION_COUNT; i++) {
			auto result = con.Query("SELECT * FROM pg_class");
			if (result->HasError()) {
				*read_correct = false;
			}
		}
	}